

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Expression * __thiscall soul::StructuralParser::parseMultiplyDivide(StructuralParser *this)

{
  bool bVar1;
  Op op;
  Expression *a;
  TokenType token;
  Expression *b;
  Context context;
  Context local_48;
  
  a = parseUnary(this);
  bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
          ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
                    ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                      *)this,(TokenType)0x2a4758,(TokenType)0x27da09,(TokenType)0x27e5a0);
  if (bVar1) {
    do {
      local_48.location.sourceCode.object = (this->super_SOULTokeniser).location.sourceCode.object;
      if (local_48.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_48.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_48.location.location.data = (this->super_SOULTokeniser).location.location.data;
      local_48.parentScope = this->currentScope;
      token = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::skip(&this->super_SOULTokeniser);
      op = getBinaryOpForToken(token);
      b = parseUnary(this);
      a = createBinaryOperator(this,&local_48,a,b,op);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48.location.sourceCode.object);
      bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
              ::matchesAny<soul::TokenType,soul::TokenType,soul::TokenType>
                        ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                          *)this,(TokenType)0x2a4758,(TokenType)0x27da09,(TokenType)0x27e5a0);
    } while (bVar1);
  }
  return a;
}

Assistant:

AST::Expression& parseMultiplyDivide()
    {
        for (pool_ref<AST::Expression> a = parseUnary();;)
        {
            if (! matchesAny (Operator::times, Operator::divide, Operator::modulo))
                return a;

            auto context = getContext();
            auto type = getBinaryOpForToken (skip());
            a = createBinaryOperator (context, a, parseUnary(), type);
        }
    }